

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
::_container_insert<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
           *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *column,Index pos,Dimension dim
          )

{
  Delete_disposer disposer;
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  *this_00;
  pointer puVar1;
  pointer pEVar2;
  data_t *pdVar3;
  node_ptr to_erase;
  pointer pEVar4;
  long lVar5;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  uint local_68;
  uint local_64;
  Dimension local_60;
  Field_operators *local_58;
  New_cloner local_50;
  undefined1 local_48 [24];
  
  lVar5 = *(long *)(this + 0xe8);
  uVar7 = (*(long *)(this + 0xf0) - lVar5 >> 3) * -0x3333333333333333;
  uVar8 = (ulong)pos;
  local_68 = dim;
  if (uVar7 < uVar8 || uVar7 - uVar8 == 0) {
    std::
    vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>>
    ::
    emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>const&,int&,Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::Column_z2_settings*&>
              ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>>
                *)(this + 0xe8),column,(int *)&local_68,(Column_z2_settings **)(this + 0x108));
  }
  else {
    local_50.entryPool_ = *(Entry_constructor **)(this + 0x108);
    local_58 = (Field_operators *)0x0;
    puVar6 = (column->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar1 = (column->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_60 = dim;
    local_48._0_8_ = (pointer)local_48;
    local_48._8_8_ = (pointer)local_48;
    if (puVar6 != puVar1) {
      local_48._16_8_ =
           (vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>>
            *)(this + 0xe8);
      do {
        local_64 = *puVar6;
        pEVar4 = Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>
                 ::construct<unsigned_int&>
                           ((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>
                             *)local_50.entryPool_,&local_64);
        if ((pEVar4->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ !=
            (node_ptr)0x0) {
          __assert_fail("!safemode_or_autounlink || node_algorithms::inited(to_insert)",
                        "/usr/include/boost/intrusive/list.hpp",0x33c,
                        "iterator boost::intrusive::list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<Boundary_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true>>::Matrix_column_tag, 1>, unsigned long, false, void>::insert(const_iterator, reference) [ValueTraits = boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<Boundary_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, true>>::Matrix_column_tag, 1>, SizeType = unsigned long, ConstantTimeSize = false, HeaderHolder = void]"
                       );
        }
        (pEVar4->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ =
             (node_ptr)local_48._8_8_;
        (pEVar4->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ =
             (node_ptr)local_48;
        pdVar3 = (data_t *)local_48._8_8_;
        local_48._8_8_ = pEVar4;
        (pdVar3->root_plus_size_).m_header.super_node.next_ = (node_ptr)pEVar4;
        puVar6 = puVar6 + 1;
      } while (puVar6 != puVar1);
      lVar5 = *(long *)local_48._16_8_;
    }
    disposer.col_ =
         (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
          *)(lVar5 + uVar8 * 0x28);
    ((disposer.col_)->super_Column_dimension_option).dim_ = local_60;
    this_00 = (list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
               *)(lVar5 + 0x18 + uVar8 * 0x28);
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
    ::
    clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>::Delete_disposer>
              (this_00,disposer);
    (disposer.col_)->operators_ = local_58;
    (disposer.col_)->entryPool_ = local_50.entryPool_;
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
    ::
    clone_from<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>::New_cloner,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>::Delete_disposer>
              (this_00,(list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>::Matrix_column_tag,_1U>,_unsigned_long,_false,_void>
                        *)local_48,local_50,disposer);
    pEVar4 = (pointer)local_48._0_8_;
    while (pEVar4 != (pointer)local_48) {
      pEVar2 = (pointer)(pEVar4->super_Column_hook).super_type.super_type.super_list_node<void_*>.
                        next_;
      (pEVar4->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ =
           (node_ptr)0x0;
      (pEVar4->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ =
           (node_ptr)0x0;
      Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>
      ::destroy(&(local_50.entryPool_)->entryPool_,pEVar4);
      pEVar4 = pEVar2;
    }
  }
  Matrix_all_dimension_holder<int>::update_up((Matrix_all_dimension_holder<int> *)this,local_68);
  return;
}

Assistant:

inline void Boundary_matrix<Master_matrix>::_container_insert(const Container& column,
                                                              Index pos,
                                                              Dimension dim)
{
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.try_emplace(pos, Column(pos, column, dim, RA_opt::rows_, colSettings_));
    } else {
      matrix_.try_emplace(pos, Column(column, dim, colSettings_));
    }
  } else {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.emplace_back(pos, column, dim, RA_opt::rows_, colSettings_);
    } else {
      if (matrix_.size() <= pos) {
        matrix_.emplace_back(column, dim, colSettings_);
      } else {
        matrix_[pos] = Column(column, dim, colSettings_);
      }
    }
  }
  if constexpr (activeDimOption) {
    Dim_opt::update_up(dim);
  }
}